

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O3

int YP_md_get_ad_value(YPSpur *spur,int num)

{
  int iVar1;
  YPSpur_msg msg;
  YPSpur_msg local_40;
  
  local_40.msg_type = 1;
  local_40.pid = (long)spur->pid;
  local_40.type = 0x500;
  local_40.cs = 0;
  local_40.data[0] = (double)num;
  iVar1 = (*(spur->dev).send)(&spur->dev,&local_40);
  if ((-1 < iVar1) && (iVar1 = (*(spur->dev).recv)(&spur->dev,&local_40), -1 < iVar1)) {
    return (int)local_40.data[0];
  }
  spur->connection_error = 1;
  return -1;
}

Assistant:

int YP_md_get_ad_value(YPSpur* spur, int num)
{
  YPSpur_msg msg;
  int len;
  int ret;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_GETAD;
  msg.cs = 0;
  msg.data[0] = (double)num;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  ret = (int)msg.data[0];
  return ret;
}